

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_info_from_callbacks(stbi_io_callbacks *c,void *user,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__context s;
  stbi__context sStack_f8;
  
  stbi__start_callbacks(&sStack_f8,c,user);
  iVar1 = stbi__info_main(&sStack_f8,x,y,comp);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_callbacks(stbi_io_callbacks const *c, void *user, int *x, int *y, int *comp) {
    stbi__context s;
    stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
    return stbi__info_main(&s, x, y, comp);
}